

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_canvas.c
# Opt level: O3

void canvas_completepath(char *from,char *to,int bufsize,_glist *x)

{
  char *__s;
  int iVar1;
  _canvasenvironment *p_Var2;
  size_t sVar3;
  undefined4 in_register_00000014;
  
  iVar1 = sys_isabsolutepath(from);
  if (iVar1 == 0) {
    if ((_glist *)CONCAT44(in_register_00000014,bufsize) == (_glist *)0x0) {
      strncpy(to,sys_libdir->s_name,0x3de);
      to[0x3df] = '\0';
      sVar3 = strlen(to);
      builtin_strncpy(to + sVar3,"/extra/",8);
    }
    else {
      p_Var2 = canvas_getenv((_glist *)CONCAT44(in_register_00000014,bufsize));
      __s = p_Var2->ce_dir->s_name;
      sVar3 = strlen(__s);
      strncpy(to,__s,(long)(0x3e800000000 - (sVar3 << 0x20)) >> 0x20);
      to[(long)(0x3e700000000 - (sVar3 << 0x20)) >> 0x20] = '\0';
      sVar3 = strlen(to);
      (to + sVar3)[0] = '/';
      (to + sVar3)[1] = '\0';
    }
  }
  else {
    *to = '\0';
  }
  sVar3 = strlen(to);
  strncat(to,from,1000 - sVar3);
  to[999] = '\0';
  return;
}

Assistant:

static void canvas_completepath(const char *from, char *to, int bufsize,
    t_canvas *x)
{
    if (sys_isabsolutepath(from))
    {
        to[0] = '\0';
    }
    else if (x)
    {
        /* append canvas dir */
        const char *dir = canvas_getdir(x)->s_name;
        int dirlen = (int)strlen(dir);
        strncpy(to, dir, bufsize-dirlen);
        to[bufsize-dirlen-1] = '\0';
        strcat(to, "/");
    }
     else
    {   /* append Pd lib dir */
        strncpy(to, sys_libdir->s_name, bufsize-10);
        to[bufsize-9] = '\0';
        strcat(to, "/extra/");
    }
    strncat(to, from, bufsize-strlen(to));
    to[bufsize-1] = '\0';
}